

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

IOHANDLE io_open(char *filename,int flags)

{
  long lVar1;
  uint uVar2;
  IOHANDLE io;
  uint in_ESI;
  long in_FS_OFFSET;
  IOHANDLE result;
  uchar buf [3];
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  char local_b;
  char local_a;
  char local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  io = io_open_impl(in_stack_ffffffffffffffc8,0);
  if ((((in_ESI & 8) != 0) && (io != (IOHANDLE)0x0)) &&
     ((uVar2 = io_read(io,in_stack_ffffffffffffffc8,0), uVar2 != 3 ||
      (((local_b != -0x11 || (local_a != -0x45)) || (local_9 != -0x41)))))) {
    io_seek((IOHANDLE)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),(int)((ulong)io >> 0x20),(int)io);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return io;
}

Assistant:

IOHANDLE io_open(const char *filename, int flags)
{
	IOHANDLE result = io_open_impl(filename, flags);
	unsigned char buf[3];
	if((flags & IOFLAG_SKIP_BOM) == 0 || !result)
	{
		return result;
	}
	if(io_read(result, buf, sizeof(buf)) != 3 || buf[0] != 0xef || buf[1] != 0xbb || buf[2] != 0xbf)
	{
		io_seek(result, 0, IOSEEK_START);
	}
	return result;
}